

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

ON_Quaternion * ON_Quaternion::Log(ON_Quaternion q)

{
  ON_Quaternion *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  
  dVar1 = Length((ON_Quaternion *)&stack0x00000008);
  dVar2 = ON_3dVector::Length((ON_3dVector *)&stack0x00000010);
  dVar2 = (double)(-(ulong)(2.2250738585072014e-308 < dVar2) & (ulong)dVar2);
  dVar3 = 0.0;
  if (0.0 < dVar2) {
    dVar3 = acos(in_stack_00000008 / dVar1);
    dVar3 = dVar3 / dVar2;
  }
  dVar1 = log(dVar1);
  ON_Quaternion(in_RDI,dVar1,in_stack_00000010 * dVar3,in_stack_00000018 * dVar3,
                dVar3 * in_stack_00000020);
  return in_RDI;
}

Assistant:

ON_Quaternion ON_Quaternion::Log(ON_Quaternion q)
{
  // Added 8 Jan 2010 - not tested yet
  double lenq = q.Length();
  double v = ((const ON_3dVector*)&q.b)->Length();
  if ( !(v > ON_DBL_MIN) )
    v = 0.0;
  double z = (v > 0.0) ? acos(q.a/lenq)/v : 0.0;
  return ON_Quaternion(log(lenq), z*q.b, z*q.c, z*q.d );
}